

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Stress::LongShaderTests::init(LongShaderTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  double dVar2;
  size_type sVar3;
  uint uVar4;
  deUint32 dVar5;
  long *plVar6;
  undefined8 *puVar7;
  TestNode *node;
  undefined4 *puVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  string desc;
  string name;
  ShaderType local_2b4;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  ulong local_270;
  uint local_264;
  uint local_260;
  uint local_25c;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b8 = 0;
  do {
    local_270 = (ulong)(uint)(&DAT_01c29f90)[local_1b8];
    local_260 = (uint)(local_1b8 < 2);
    dVar2 = floor(SQRT((double)local_270));
    local_1b0 = (long)dVar2 & 0xffffffff;
    if ((uint)(long)dVar2 < 0xb) {
      local_1b0 = 10;
    }
    local_264 = (uint)(local_1b0 >> 1);
    if (9 < local_264) {
      local_264 = 10;
    }
    uVar4 = 1;
    local_2b4 = SHADERTYPE_VERTEX;
    do {
      local_25c = uVar4;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_2b0 = &local_2a0;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_2a0 = *plVar9;
        lStack_298 = plVar6[3];
      }
      else {
        local_2a0 = *plVar9;
        local_2b0 = (long *)*plVar6;
      }
      local_2a8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getShaderTypeName(local_2b4);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = plVar6[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*plVar6;
      }
      local_1d0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Compile ","");
      glu::getShaderTypeName(local_2b4);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_1f8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_208 = *plVar9;
        lStack_200 = plVar6[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar9;
        local_218 = (long *)*plVar6;
      }
      local_210 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_218);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_248 = *puVar10;
        lStack_240 = plVar6[3];
        local_258 = &local_248;
      }
      else {
        local_248 = *puVar10;
        local_258 = (ulong *)*plVar6;
      }
      local_250 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if (local_258 != &local_248) {
        uVar11 = local_248;
      }
      if (uVar11 < (ulong)(local_230 + local_250)) {
        uVar11 = 0xf;
        if (local_238 != local_228) {
          uVar11 = local_228[0];
        }
        if (uVar11 < (ulong)(local_230 + local_250)) goto LAB_013926f4;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_258);
      }
      else {
LAB_013926f4:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_238);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_280 = *plVar6;
        uStack_278 = puVar7[3];
        local_290 = &local_280;
      }
      else {
        local_280 = *plVar6;
        local_290 = (long *)*puVar7;
      }
      local_288 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_2b0 = &local_2a0;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_2a0 = *plVar9;
        lStack_298 = plVar6[3];
      }
      else {
        local_2a0 = *plVar9;
        local_2b0 = (long *)*plVar6;
      }
      local_2a8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      node = (TestNode *)operator_new(0x120);
      plVar6 = local_1d8;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)node,pCVar1->m_testCtx,(char *)local_1d8,(char *)local_2b0);
      node[1]._vptr_TestNode = (_func_int **)pCVar1;
      node->_vptr_TestNode = (_func_int **)&PTR__LongShaderCompileStressCase_02151420;
      *(ShaderType *)&node[1].m_testCtx = local_2b4;
      *(uint *)((long)&node[1].m_testCtx + 4) = local_260;
      dVar5 = deStringHash((char *)plVar6);
      deRandom_init((deRandom *)&node[1].m_name,dVar5 ^ 0xac9c91d);
      sVar3 = node[1].m_name._M_string_length;
      node[1].m_name.field_2._M_allocated_capacity = (size_type)node[1].m_name._M_dataplus._M_p;
      *(size_type *)((long)&node[1].m_name.field_2 + 8) = sVar3;
      *(ShaderType *)&node[1].m_description._M_dataplus._M_p = local_2b4;
      *(int *)((long)&node[1].m_description._M_dataplus._M_p + 4) = (int)local_270;
      *(int *)&node[1].m_description._M_string_length = (int)local_1b0;
      *(uint *)((long)&node[1].m_description._M_string_length + 4) = local_264;
      node[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&node[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&node[1].m_nodeType = 0;
      puVar8 = (undefined4 *)operator_new(4);
      *(undefined4 **)&node[1].m_description.field_2 = puVar8;
      *(undefined4 **)&node[1].m_nodeType = puVar8 + 1;
      *puVar8 = 0;
      *(undefined4 **)((long)&node[1].m_description.field_2 + 8) = puVar8 + 1;
      *(undefined4 *)
       &node[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = 1;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&node[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&node[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&node[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined4 *)((long)&node[2].m_name._M_string_length + 4) = 0;
      node[2].m_name.field_2._M_allocated_capacity = (size_type)&node[2].m_description;
      *(undefined8 *)((long)&node[2].m_name.field_2 + 8) = 0;
      *(undefined1 *)&node[2].m_description._M_dataplus._M_p = 0;
      tcu::TestNode::addChild((TestNode *)this,node);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      local_2b4 = SHADERTYPE_FRAGMENT;
      uVar4 = 0;
    } while ((local_25c & 1) != 0);
    local_1b8 = local_1b8 + 1;
    if (local_1b8 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

void LongShaderTests::init (void)
{
	const deUint32	requireLinkOkMaxOps	= 1000;

	const deUint32	caseOpCounts[] =
	{
		100,
		1000,
		10000,
		100000
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(caseOpCounts); caseNdx++)
	{
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 0) ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT;
			const deUint32			opCount			= caseOpCounts[caseNdx];
			const deUint32			flags			= (opCount <= requireLinkOkMaxOps) ? CASE_REQUIRE_LINK_STATUS_OK : 0;

			const std::string		name			= de::toString(opCount) + "_operations_" + glu::getShaderTypeName(shaderType);
			const std::string		desc			= std::string("Compile ") + glu::getShaderTypeName(shaderType) + " shader with " + de::toString(opCount) + " operations";

			LongShaderSpec			caseSpec		(shaderType, opCount);

			addChild(new LongShaderCompileStressCase(m_context, name.c_str(), desc.c_str(), caseSpec, flags));
		}
	}
}